

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

char * str_utf8_skip_whitespaces(char *str)

{
  char *pcVar1;
  int iVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = in_RDI;
  do {
    pcVar1 = local_20;
    if (*local_20 == '\0') break;
    iVar2 = str_utf8_decode(&local_20);
    iVar2 = str_utf8_is_whitespace(iVar2);
  } while (iVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pcVar1;
  }
  __stack_chk_fail();
}

Assistant:

const char *str_utf8_skip_whitespaces(const char *str)
{
	const char *str_old;
	int code;

	while(*str)
	{
		str_old = str;
		code = str_utf8_decode(&str);

		if(!str_utf8_is_whitespace(code))
		{
			return str_old;
		}
	}

	return str;
}